

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O0

void __thiscall TestVariableImportCorrectness::Run(TestVariableImportCorrectness *this)

{
  bool bVar1;
  int local_1c;
  int t;
  char *testVariableImportCorrectness;
  TestVariableImportCorrectness *this_local;
  
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)(Tests::enableLogFiles & 1),(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)(Tests::enableTimeTrace & 1));
  nullcInitDynamicModule();
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if ((*(byte *)((long)&Tests::testExecutor + (long)local_1c) & 1) != 0) {
      testsCount[local_1c] = testsCount[local_1c] + 1;
      bVar1 = Tests::RunCodeSimple
                        ("import std.dynamic;\r\nint x = 2;\r\neval(\"x = 4;\");\r\n{ int n, m; }\r\nint y = 3;\r\neval(\"y = 8;\");\r\nreturn x * 10 + y;"
                         ,testTarget[local_1c],"48","Variable import correctness [skip_c]",false,"")
      ;
      if (bVar1) {
        testsPassed[local_1c] = testsPassed[local_1c] + 1;
      }
    }
  }
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();

		const char	*testVariableImportCorrectness =
"import std.dynamic;\r\n\
int x = 2;\r\n\
eval(\"x = 4;\");\r\n\
{ int n, m; }\r\n\
int y = 3;\r\n\
eval(\"y = 8;\");\r\n\
return x * 10 + y;";
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;

			testsCount[t]++;
			if(Tests::RunCodeSimple(testVariableImportCorrectness, testTarget[t], "48", "Variable import correctness [skip_c]", false, ""))
				testsPassed[t]++;
		}
	}